

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O2

void __thiscall
spdlog::logger::log_<unsigned_int>
          (logger *this,source_loc loc,level_enum lvl,string_view_t fmt,uint *args)

{
  int iVar1;
  string_view_t a_logger_name;
  string_view_t msg;
  bool traceback_enabled;
  format_args args_00;
  log_msg log_msg;
  memory_buf_t buf;
  
  iVar1 = (this->level_).super___atomic_base<int>._M_i;
  traceback_enabled = details::backtracer::enabled(&this->tracer_);
  if (iVar1 <= (int)lvl || traceback_enabled) {
    buf.super_buffer<char>.ptr_ = buf.store_;
    buf.super_buffer<char>.size_ = 0;
    buf.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_001d0200;
    buf.super_buffer<char>.capacity_ = 0xfa;
    log_msg.logger_name.data_ = (char *)(ulong)*args;
    args_00.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)&log_msg;
    args_00.desc_ = 2;
    ::fmt::v9::vformat_to<fmt::v9::appender,_0>((appender)&buf,fmt,args_00);
    a_logger_name.data_ = (this->name_)._M_dataplus._M_p;
    a_logger_name.size_ = (this->name_)._M_string_length;
    msg.size_ = buf.super_buffer<char>.size_;
    msg.data_ = buf.super_buffer<char>.ptr_;
    details::log_msg::log_msg(&log_msg,loc,a_logger_name,lvl,msg);
    log_it_(this,&log_msg,iVar1 <= (int)lvl,traceback_enabled);
    ::fmt::v9::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::deallocate(&buf);
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, string_view_t fmt, Args &&... args)
    {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled)
        {
            return;
        }
        SPDLOG_TRY
        {
            memory_buf_t buf;
#ifdef SPDLOG_USE_STD_FORMAT
            fmt_lib::vformat_to(std::back_inserter(buf), fmt, fmt_lib::make_format_args(std::forward<Args>(args)...));
#else
            fmt::vformat_to(fmt::appender(buf), fmt, fmt::make_format_args(std::forward<Args>(args)...));
#endif

            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }